

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaPValAttrNodeValue
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,
              xmlChar *value,xmlSchemaTypePtr type)

{
  int iVar1;
  char *message;
  xmlParserErrors error;
  xmlChar *unaff_RBX;
  xmlChar *unaff_R12;
  
  if (value != (xmlChar *)0x0) {
    if (*(int *)value == 1) {
      if ((*(uint *)(value + 0xa0) < 0x1e) &&
         ((0x20630000U >> (*(uint *)(value + 0xa0) & 0x1f) & 1) != 0)) {
        iVar1 = xmlSchemaValPredefTypeNode
                          ((xmlSchemaTypePtr)value,(xmlChar *)attr,(xmlSchemaValPtr *)0x0,
                           (xmlNodePtr)ownerItem);
        if (-1 < iVar1) {
          if (iVar1 == 0) {
            return 0;
          }
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((*(uint *)(value + 0x58) & 0x40) == 0);
          xmlSchemaPSimpleTypeErr
                    (pctxt,error,ownerItem,(xmlNodePtr)value,(xmlSchemaTypePtr)0x0,(char *)attr,
                     (xmlChar *)0x0,(char *)0x0,unaff_RBX,unaff_R12);
          return error;
        }
        message = "failed to validate a schema attribute value";
      }
      else {
        message = "validation using the given type is not supported while parsing a schema";
      }
    }
    else {
      message = "the given type is not a built-in type";
    }
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaPValAttrNodeValue",message,(xmlChar *)0x0,
               (xmlChar *)type);
  }
  return -1;
}

Assistant:

static int
xmlSchemaPValAttrNodeValue(xmlSchemaParserCtxtPtr pctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlAttrPtr attr,
			   const xmlChar *value,
			   xmlSchemaTypePtr type)
{

    int ret = 0;

    /*
    * NOTE: Should we move this to xmlschematypes.c? Hmm, but this
    * one is really meant to be used internally, so better not.
    */
    if ((pctxt == NULL) || (type == NULL) || (attr == NULL))
	return (-1);
    if (type->type != XML_SCHEMA_TYPE_BASIC) {
	PERROR_INT("xmlSchemaPValAttrNodeValue",
	    "the given type is not a built-in type");
	return (-1);
    }
    switch (type->builtInType) {
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	    ret = xmlSchemaValPredefTypeNode(type, value, NULL,
		(xmlNodePtr) attr);
	    break;
	default: {
	    PERROR_INT("xmlSchemaPValAttrNodeValue",
		"validation using the given type is not supported while "
		"parsing a schema");
	    return (-1);
	}
    }
    /*
    * TODO: Should we use the S4S error codes instead?
    */
    if (ret < 0) {
	PERROR_INT("xmlSchemaPValAttrNodeValue",
	    "failed to validate a schema attribute value");
	return (-1);
    } else if (ret > 0) {
	if (WXS_IS_LIST(type))
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	else
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	xmlSchemaPSimpleTypeErr(pctxt,
	    ret, ownerItem, (xmlNodePtr) attr,
	    type, NULL, value, NULL, NULL, NULL);
    }
    return (ret);
}